

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O3

void __thiscall
indigox::algorithm::AStarOptimisation::PopulateInitialDistribution
          (AStarOptimisation *this,p_AStarQueueItem *d)

{
  ulong *puVar1;
  ElectronOpt *pEVar2;
  element_type *peVar3;
  pointer puVar4;
  pointer puVar5;
  void *pvVar6;
  pointer puVar7;
  pointer puVar8;
  pointer ppVar9;
  bool bVar10;
  byte bVar11;
  AdjList *g;
  mapped_type *__k;
  mapped_type_conflict1 *pmVar12;
  ulong uVar13;
  ulong uVar14;
  size_type sVar15;
  MolVertPair startID;
  allocator<unsigned_long> local_79;
  undefined1 local_78 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  p_AStarQueueItem local_40;
  p_AStarQueueItem local_30;
  
  pEVar2 = (this->super_ElectronOptimisationAlgorithm).parent_;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             (long)(pEVar2->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar2->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,0,&local_79);
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((element_type *)local_78 != peVar3) {
    puVar4 = (peVar3->distribution).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (peVar3->distribution).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (peVar3->distribution).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
    (peVar3->distribution).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
    (peVar3->distribution).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4,(long)puVar5 - (long)puVar4);
    }
    (peVar3->distribution).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  puVar4 = (peVar3->distribution).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = *(pointer *)
            ((long)&(peVar3->distribution).m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (puVar4 != puVar5) {
    memset(puVar4,0,(long)puVar5 - (long)puVar4 & 0xfffffffffffffff8);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             *(size_t *)
              ((long)&((((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super__ElnGraph).graph_.
                       super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_type + 0x28),0,&local_79);
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((element_type *)local_78 != (element_type *)&peVar3->unchangeable) {
    pvVar6 = (peVar3->unchangeable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&(peVar3->unchangeable).m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 0x10);
    (peVar3->unchangeable).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
    *(undefined8 *)
     ((long)&(peVar3->unchangeable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data + 8) = local_78._8_8_;
    *(undefined8 *)
     ((long)&(peVar3->unchangeable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data + 0x10) = local_78._16_8_;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)puVar4 - (long)pvVar6);
    }
    (peVar3->unchangeable).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->unchangeable);
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  sVar15 = (peVar3->unchangeable).m_num_bits;
  if (sVar15 != 0) {
    puVar7 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar13 = 0;
    uVar14 = 1;
    do {
      if ((ulong)((long)puVar8 - (long)puVar7) <= uVar13) goto LAB_00118b53;
      if (puVar7[uVar13] != '\0') {
        bVar11 = (byte)uVar13 & 0x3f;
        puVar1 = (ulong *)((long)(peVar3->unchangeable).m_bits.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + (uVar13 >> 6) * 8);
        *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        sVar15 = (peVar3->unchangeable).m_num_bits;
      }
      bVar10 = uVar14 < sVar15;
      uVar13 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar10);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             *(size_t *)
              ((long)&((((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super__ElnGraph).graph_.
                       super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_type + 0x28),0,&local_79);
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((element_type *)local_78 != (element_type *)&peVar3->calculable) {
    pvVar6 = (peVar3->calculable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&(peVar3->calculable).m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 0x10);
    (peVar3->calculable).m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
    *(undefined8 *)
     ((long)&(peVar3->calculable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data + 8) = local_78._8_8_;
    *(undefined8 *)
     ((long)&(peVar3->calculable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data + 0x10) = local_78._16_8_;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)puVar4 - (long)pvVar6);
    }
    (peVar3->calculable).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  puVar4 = (peVar3->calculable).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->calculable).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar5) {
    memset(puVar4,0,(long)puVar5 - (long)puVar4 & 0xfffffffffffffff8);
  }
  local_30.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_30.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_30.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_30.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar3;
  DetermineCalculable(this,&local_30);
  if (local_30.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_78,
             &(peVar3->calculable).m_bits);
  local_78._24_8_ = (peVar3->calculable).m_num_bits;
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((element_type *)local_78 != (element_type *)&peVar3->new_calculable) {
    pvVar6 = (peVar3->new_calculable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&(peVar3->new_calculable).m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 0x10);
    (peVar3->new_calculable).m_bits.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
    *(undefined8 *)
     ((long)&(peVar3->new_calculable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data + 8) = local_78._8_8_;
    *(undefined8 *)
     ((long)&(peVar3->new_calculable).m_bits.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data + 0x10) = local_78._16_8_;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)puVar4 - (long)pvVar6);
    }
    (peVar3->new_calculable).m_num_bits = local_78._24_8_;
    local_78._24_8_ = 0;
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
  (local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->parent_path_cost = 0;
  local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CalculatePathEnergy(this,&local_40);
  if (local_40.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar3->path_cost != Options::AssignElectrons::INF) {
    local_48 = (d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
    local_78._40_8_ = peVar3;
    CalculateHeuristicEnergy(this,(p_AStarQueueItem *)(local_78 + 0x28));
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  peVar3 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3->nbr_start_idx = 0;
  pEVar2 = (this->super_ElectronOptimisationAlgorithm).parent_;
  ppVar9 = (pEVar2->possibleLocations_).
           super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pEVar2->possibleLocations_).
      super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppVar9) {
    peVar3->nbr_count = '\0';
  }
  else {
    local_78._0_8_ = ppVar9->first;
    local_78._8_8_ = ppVar9->second;
    __k = std::
          map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
          ::at(&this->idsToVertex_,(key_type *)local_78);
    pmVar12 = std::
              map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              ::at(&this->vert2pos_,__k);
    puVar7 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->uniqueIDs_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar7) <= *pmVar12) {
LAB_00118b53:
      do {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      } while( true );
    }
    ((d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ->nbr_count = puVar7[*pmVar12];
  }
  return;
}

Assistant:

void AStarOptimisation::PopulateInitialDistribution(p_AStarQueueItem d) {
  d->distribution = ElnDist(parent_->possibleLocations_.size());
  d->distribution.reset();
  
  d->unchangeable = VertMask(parent_->elnGraph_->NumVertices());
  d->unchangeable.set();
  for (unsigned int i = 0; i < d->unchangeable.size(); ++i) {
    if (uniqueIDs_.at(i) > 0)
      d->unchangeable.reset(i);
  }
  
  d->calculable = VertMask(parent_->elnGraph_->NumVertices());
  d->calculable.reset();
  DetermineCalculable(d);
  d->new_calculable = VertMask(d->calculable);
  
  d->parent_path_cost = 0;
  CalculatePathEnergy(d);
  if (d->path_cost != opt_::INF) CalculateHeuristicEnergy(d);
  
  d->nbr_start_idx = 0;
  if (parent_->possibleLocations_.size()) {
    MolVertPair startID = parent_->possibleLocations_.at(0);
    size_t startVert = vert2pos_.at(idsToVertex_.at(startID));
    d->nbr_count = (uint32_t)uniqueIDs_.at(startVert);
  } else d->nbr_count = 0;
}